

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O1

bool CaseInsensitiveEqual(string *s1,string *s2)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  long in_FS_OFFSET;
  bool bVar9;
  
  uVar2 = s1->_M_string_length;
  if (uVar2 == s2->_M_string_length) {
    bVar9 = uVar2 == 0;
    if (!bVar9) {
      pbVar3 = (byte *)(s1->_M_dataplus)._M_p;
      pbVar4 = (byte *)(s2->_M_dataplus)._M_p;
      bVar1 = *pbVar3;
      bVar7 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar7 = bVar1;
      }
      bVar1 = *pbVar4;
      bVar8 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar8 = bVar1;
      }
      if (bVar7 == bVar8) {
        uVar5 = 1;
        do {
          uVar6 = uVar5;
          if (uVar2 == uVar6) break;
          bVar1 = pbVar3[uVar6];
          bVar7 = bVar1 | 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar7 = bVar1;
          }
          bVar1 = pbVar4[uVar6];
          bVar8 = bVar1 | 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar8 = bVar1;
          }
          uVar5 = uVar6 + 1;
        } while (bVar7 == bVar8);
        bVar9 = uVar2 <= uVar6;
      }
    }
  }
  else {
    bVar9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool CaseInsensitiveEqual(const std::string& s1, const std::string& s2)
{
    if (s1.size() != s2.size()) return false;
    for (size_t i = 0; i < s1.size(); ++i) {
        char c1 = s1[i];
        if (c1 >= 'A' && c1 <= 'Z') c1 -= ('A' - 'a');
        char c2 = s2[i];
        if (c2 >= 'A' && c2 <= 'Z') c2 -= ('A' - 'a');
        if (c1 != c2) return false;
    }
    return true;
}